

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O3

char * src_get_name(int converter_type)

{
  char *pcVar1;
  
  pcVar1 = sinc_get_name(converter_type);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = zoh_get_name(converter_type);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = linear_get_name(converter_type);
      return pcVar1;
    }
  }
  return pcVar1;
}

Assistant:

const char *
src_get_name (int converter_type)
{	const char *desc ;

	if ((desc = sinc_get_name (converter_type)) != NULL)
		return desc ;

	if ((desc = zoh_get_name (converter_type)) != NULL)
		return desc ;

	if ((desc = linear_get_name (converter_type)) != NULL)
		return desc ;

	return NULL ;
}